

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_server.c
# Opt level: O0

void ssdp_event_handler_thread(void *the_data)

{
  int iVar1;
  http_message_t *hmsg;
  ssdp_thread_data *data;
  void *the_data_local;
  
  iVar1 = start_event_handler(the_data);
  if (iVar1 == 0) {
    if ((*(int *)((long)the_data + 4) == 8) || (*(int *)((long)the_data + 0xd8) == 9)) {
      ssdp_handle_ctrlpt_msg
                ((http_message_t *)the_data,(sockaddr_storage *)((long)the_data + 0x1f0),0);
    }
    else {
      ssdp_handle_device_request
                ((http_message_t *)the_data,(sockaddr_storage *)((long)the_data + 0x1f0));
    }
    free_ssdp_event_handler_data(the_data);
  }
  return;
}

Assistant:

static void ssdp_event_handler_thread(
	/*! [] ssdp_thread_data structure. This structure contains SSDP
	 * request message. */
	void *the_data)
{
	ssdp_thread_data *data = (ssdp_thread_data *)the_data;
	http_message_t *hmsg = &data->parser.msg;

	if (start_event_handler(the_data) != 0)
		return;
	/* send msg to device or ctrlpt */
	if (hmsg->method == (http_method_t)HTTPMETHOD_NOTIFY ||
		hmsg->request_method == (http_method_t)HTTPMETHOD_MSEARCH) {
	#ifdef INCLUDE_CLIENT_APIS
		ssdp_handle_ctrlpt_msg(hmsg, &data->dest_addr, 0);
	#endif /* INCLUDE_CLIENT_APIS */
	} else {
		ssdp_handle_device_request(hmsg, &data->dest_addr);
	}

	/* free data */
	free_ssdp_event_handler_data(data);
}